

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

void __thiscall
FIX::double_conversion::StringBuilder::AddSubstring(StringBuilder *this,char *s,int n)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  char *__dest;
  int n_local;
  char *s_local;
  StringBuilder *this_local;
  
  bVar3 = is_finalized(this);
  bVar2 = false;
  if (!bVar3) {
    iVar1 = this->position_;
    iVar4 = Vector<char>::length(&this->buffer_);
    bVar2 = iVar1 + n < iVar4;
  }
  if (!bVar2) {
    __assert_fail("!is_finalized() && position_ + n < buffer_.length()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/utils.h"
                  ,0xff,
                  "void FIX::double_conversion::StringBuilder::AddSubstring(const char *, int)");
  }
  sVar5 = strlen(s);
  if ((ulong)(long)n <= sVar5) {
    __dest = Vector<char>::operator[](&this->buffer_,this->position_);
    memmove(__dest,s,(long)n);
    this->position_ = n + this->position_;
    return;
  }
  __assert_fail("static_cast<size_t>(n) <= strlen(s)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/utils.h"
                ,0x100,"void FIX::double_conversion::StringBuilder::AddSubstring(const char *, int)"
               );
}

Assistant:

void AddSubstring(const char* s, int n) {
    ASSERT(!is_finalized() && position_ + n < buffer_.length());
    ASSERT(static_cast<size_t>(n) <= strlen(s));
    memmove(&buffer_[position_], s, n * kCharSize);
    position_ += n;
  }